

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManCutSupp(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  
  pVVar2 = Llb_ManCutNodes(p,vLower,vUpper);
  Aig_ManIncrementTravId(p);
  iVar4 = 0;
  while( true ) {
    if (pVVar2->nSize <= iVar4) {
      Vec_PtrFree(pVVar2);
      pVVar2 = Vec_PtrAlloc(100);
      for (iVar4 = 0; iVar4 < vLower->nSize; iVar4 = iVar4 + 1) {
        pvVar3 = Vec_PtrEntry(vLower,iVar4);
        if (*(int *)((long)pvVar3 + 0x20) == p->nTravIds) {
          Vec_PtrPush(pVVar2,pvVar3);
        }
      }
      return pVVar2;
    }
    pvVar3 = Vec_PtrEntry(pVVar2,iVar4);
    if ((*(uint *)((long)pvVar3 + 0x18) & 7) - 7 < 0xfffffffe) break;
    iVar1 = p->nTravIds;
    *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x20) = iVar1;
    *(int *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x20) = iVar1;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                ,0x19b,"Vec_Ptr_t *Llb_ManCutSupp(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupp( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vNodes, * vSupp;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Llb_ManCutNodes( p, vLower, vUpper );
    // mark support of the nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin1(pObj) );
    }
    Vec_PtrFree( vNodes );
    // collect the support nodes
    vSupp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vSupp, pObj );
    return vSupp;

}